

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::MockEndpoint::MockEndpoint
          (MockEndpoint *this,event_base *aEventBase,Address *aAddr,uint16_t aPort)

{
  (this->super_Endpoint).mReceiver.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Endpoint).mReceiver._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Endpoint).mReceiver.super__Function_base._M_functor + 8) = 0;
  (this->super_Endpoint)._vptr_Endpoint = (_func_int **)&PTR__MockEndpoint_002773d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->mAddr).mBytes,&aAddr->mBytes);
  this->mPort = aPort;
  this->mPeer = (MockEndpoint *)0x0;
  this->mDropMessage = false;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->mSendQueue).c.
  super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&this->mSendQueue,0);
  event_assign(&this->mSendEvent,aEventBase,-1,0x10,SendEventCallback,this);
  event_add(&this->mSendEvent,(timeval *)0x0);
  return;
}

Assistant:

MockEndpoint(struct event_base *aEventBase, const Address &aAddr, uint16_t aPort)
        : mAddr(aAddr)
        , mPort(aPort)
        , mPeer(nullptr)
        , mDropMessage(false)
    {
        event_assign(&mSendEvent, aEventBase, -1, EV_PERSIST, SendEventCallback, this);
        event_add(&mSendEvent, nullptr);
    }